

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O2

int __thiscall
cinatra::http_parser::parse_request(http_parser *this,char *data,size_t size,int last_len)

{
  string_view *this_00;
  char *pcVar1;
  int iVar2;
  http_method hVar3;
  size_type sVar4;
  char *extraout_RDX;
  string_view mthd;
  basic_string_view<char,_std::char_traits<char>_> str;
  bool has_query;
  size_t url_len;
  char *url;
  size_t method_len;
  char *method;
  int minor_version;
  
  this->num_headers_ = 100;
  has_query = false;
  iVar2 = detail::phr_parse_request
                    (data,size,&method,&method_len,&url,&url_len,&minor_version,
                     (this->headers_)._M_elems,&this->num_headers_,(long)last_len,
                     &this->has_connection_,&this->has_close_,&this->has_upgrade_,&has_query);
  this->header_len_ = iVar2;
  if (iVar2 < 0) {
    if (this->num_headers_ == 100) {
      output_error(this);
    }
  }
  else {
    (this->method_)._M_len = method_len;
    (this->method_)._M_str = method;
    this_00 = &this->url_;
    (this->url_)._M_len = url_len;
    (this->url_)._M_str = url;
    mthd._M_str = extraout_RDX;
    mthd._M_len = (size_t)method;
    hVar3 = method_type((cinatra *)method_len,mthd);
    if (hVar3 - GET < 2) {
      this->body_len_ = 0;
    }
    else {
      parse_body_len(this);
    }
    pcVar1 = (this->url_)._M_str;
    (this->full_url_)._M_len = this_00->_M_len;
    (this->full_url_)._M_str = pcVar1;
    if ((this->queries_)._M_h._M_element_count != 0) {
      std::
      _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::clear(&(this->queries_)._M_h);
    }
    if (has_query == true) {
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find(this_00,'?',0);
      str = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (this_00,sVar4 + 1,~sVar4 + url_len);
      parse_query(this,str);
      (this->url_)._M_len = sVar4;
      (this->url_)._M_str = url;
    }
  }
  return this->header_len_;
}

Assistant:

int parse_request(const char *data, size_t size, int last_len) {
    int minor_version;

    num_headers_ = CINATRA_MAX_HTTP_HEADER_FIELD_SIZE;

    const char *method;
    size_t method_len;
    const char *url;
    size_t url_len;

    bool has_query{};
    header_len_ = detail::phr_parse_request(
        data, size, &method, &method_len, &url, &url_len, &minor_version,
        headers_.data(), &num_headers_, last_len, has_connection_, has_close_,
        has_upgrade_, has_query);

    if (header_len_ < 0) [[unlikely]] {
      CINATRA_LOG_WARNING << "parse http head failed";
      if (num_headers_ == CINATRA_MAX_HTTP_HEADER_FIELD_SIZE) {
        output_error();
      }
      return header_len_;
    }

    method_ = {method, method_len};
    url_ = {url, url_len};

    auto methd_type = method_type(method_);
    if (methd_type == http_method::GET || methd_type == http_method::HEAD) {
      body_len_ = 0;
    }
    else {
      parse_body_len();
    }

    full_url_ = url_;
    if (!queries_.empty()) {
      queries_.clear();
    }
    if (has_query) {
      size_t pos = url_.find('?');
      parse_query(url_.substr(pos + 1, url_len - pos - 1));
      url_ = {url, pos};
    }

    return header_len_;
  }